

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall
kj::_::BTreeImpl::rotateLeft
          (BTreeImpl *this,Parent *left,Parent *right,Parent *parent,uint indexInParent,
          MaybeUint **fixup)

{
  undefined8 uVar1;
  MaybeUint *pMVar2;
  
  pMVar2 = parent->keys + indexInParent;
  left->keys[3].i = pMVar2->i;
  if (*fixup == pMVar2) {
    *fixup = left->keys + 3;
  }
  pMVar2->i = right->keys[0].i;
  left->children[4] = right->children[0];
  uVar1 = *(undefined8 *)(right->keys + 3);
  *(undefined8 *)right->keys = *(undefined8 *)(right->keys + 1);
  *(undefined8 *)(right->keys + 2) = uVar1;
  *(undefined8 *)(right->keys + 4) = *(undefined8 *)(right->keys + 5);
  right->keys[6].i = 0;
  uVar1 = *(undefined8 *)(right->children + 3);
  *(undefined8 *)(right->children + 4) = *(undefined8 *)(right->children + 5);
  *(undefined8 *)right->children = *(undefined8 *)(right->children + 1);
  *(undefined8 *)(right->children + 2) = uVar1;
  right->children[6] = right->children[7];
  right->children[7] = 0;
  return;
}

Assistant:

void BTreeImpl::rotateLeft(
    Parent& left, Parent& right, Parent& parent, uint indexInParent, MaybeUint*& fixup) {
  // Steal one item from the right node and move it to the left node.

  // Like merge(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(left.isHalfFull());
  KJ_DASSERT(right.isMostlyFull());

  constexpr size_t mid = Parent::NKEYS/2;
  left.keys[mid] = parent.keys[indexInParent];
  if (fixup == &parent.keys[indexInParent]) fixup = &left.keys[mid];
  parent.keys[indexInParent] = right.keys[0];
  left.children[mid + 1] = right.children[0];
  amove(right.keys, right.keys + 1, Parent::NKEYS - 1);
  right.keys[Parent::NKEYS - 1] = nullptr;
  amove(right.children, right.children + 1, Parent::NCHILDREN - 1);
  right.children[Parent::NCHILDREN - 1] = 0;
}